

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

void dg::llvmdg::LLVMSlicer::adjustBBlocksSucessors(LLVMDependenceGraph *graph,uint32_t slice_id)

{
  BBlock<dg::LLVMNode> *target;
  BBlock<dg::LLVMNode> *this;
  BBlock<dg::LLVMNode> *pBVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  LLVMBBlock *B;
  _Rb_tree_node_base *p_Var7;
  uint i;
  DGContainer<unsigned_char,_8U> labels;
  BBlockEdge local_68;
  undefined8 local_58;
  BBlockLabelTy *local_50;
  BBlockLabelTy *local_48;
  undefined8 local_40;
  
  p_Var7 = *(_Rb_tree_node_base **)(graph + 0x78);
  target = *(BBlock<dg::LLVMNode> **)(graph + 0x98);
  B = (BBlock<dg::LLVMNode> *)0x0;
  do {
    if (p_Var7 == (_Rb_tree_node_base *)(graph + 0x68)) {
      if (B != (BBlock<dg::LLVMNode> *)0x0) {
        DependenceGraph<dg::LLVMNode>::addBlock((DependenceGraph<dg::LLVMNode> *)graph,B->key,B);
      }
      return;
    }
    llvm::BasicBlock::getTerminator();
    this = (BBlock<dg::LLVMNode> *)p_Var7[1]._M_parent;
    sVar5 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar5 != 0) {
      if (sVar5 == 2) {
        if ((((*(uint32_t *)
                &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                 _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id)
             && (bVar2 = BBlock<dg::LLVMNode>::successorsAreSame(this), !bVar2)) &&
            (bVar2 = BBlock<dg::LLVMNode>::hasSuccessor(this,this), bVar2)) &&
           (uVar3 = BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,this), uVar3 == 0)) {
          abort();
        }
        sVar5 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      if ((sVar5 == 1) &&
         (*(uint32_t *)
           &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
            _M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id)) {
        p_Var6 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_68.target = *(BBlock<dg::LLVMNode> **)(p_Var6 + 1);
        local_68._8_8_ = (ulong)p_Var6[1]._M_parent & 0xffffffffffffff00;
        pBVar1 = local_68.target;
        if ((local_68.target == target) && (pBVar1 = B, B == (BBlock<dg::LLVMNode> *)0x0)) {
          B = addNewExitBB(graph);
          pBVar1 = B;
        }
        local_68.target = pBVar1;
        BBlock<dg::LLVMNode>::removeSuccessors(this);
        BBlock<dg::LLVMNode>::addSuccessor(this,&local_68);
      }
      else {
        local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
        local_58 = 0;
        local_50 = &local_68.label;
        local_40 = 0;
        local_48 = local_50;
        for (p_Var6 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ; (_Rb_tree_header *)p_Var6 !=
              &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          if ((*(uchar *)&p_Var6[1]._M_parent != 0xff) &&
             (*(BBlock<dg::LLVMNode> **)(p_Var6 + 1) != target)) {
            DGContainer<unsigned_char,_8U>::insert
                      ((DGContainer<unsigned_char,_8U> *)&local_68,*(uchar *)&p_Var6[1]._M_parent);
          }
        }
        for (uVar3 = 0; uVar4 = llvm::Instruction::getNumSuccessors(), uVar3 < uVar4;
            uVar3 = uVar3 + 1) {
          bVar2 = DGContainer<unsigned_char,_8U>::contains
                            ((DGContainer<unsigned_char,_8U> *)&local_68,(uchar)uVar3);
          if (!bVar2) {
            if (B == (LLVMBBlock *)0x0) {
              B = addNewExitBB(graph);
            }
            BBlock<dg::LLVMNode>::addSuccessor(this,B,(uchar)uVar3);
          }
        }
        if (B != (LLVMBBlock *)0x0) {
          BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,target);
        }
        if ((1 < (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
           (bVar2 = BBlock<dg::LLVMNode>::successorsAreSame(this), bVar2)) {
          pBVar1 = *(BBlock<dg::LLVMNode> **)
                    ((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    + 1);
          BBlock<dg::LLVMNode>::removeSuccessors(this);
          BBlock<dg::LLVMNode>::addSuccessor(this,pBVar1,'\0');
        }
        std::
        _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
        ::~_Rb_tree((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)&local_68);
      }
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

static void adjustBBlocksSucessors(LLVMDependenceGraph *graph,
                                       uint32_t slice_id) {
        LLVMBBlock *oldExitBB = graph->getExitBB();
        assert(oldExitBB && "Don't have exit BB");

        LLVMBBlock *newExitBB = nullptr;

        for (auto &it : graph->getBlocks()) {
            const llvm::BasicBlock *llvmBB =
                    llvm::cast<llvm::BasicBlock>(it.first);
            const auto *const tinst = llvmBB->getTerminator();
            LLVMBBlock *BB = it.second;

            // nothing to do
            if (BB->successorsNum() == 0)
                continue;

            // if the BB has two successors and one is self-loop and
            // the branch inst is going to be removed, then the brach
            // that created the self-loop has no meaning to the sliced
            // program and this is going to be an unconditional jump
            // to the other branch
            // NOTE: do this before the next action, to rename the label if
            // needed
            if (BB->successorsNum() == 2 &&
                BB->getLastNode()->getSlice() != slice_id &&
                !BB->successorsAreSame() && BB->hasSuccessor(BB)) {
                bool found = BB->removeSuccessorsTarget(BB);
                // we have two different successors, none of them
                // is self-loop and we're slicing away the brach inst?
                // This should not happen...
                if (!found) {
                    assert(found && "Self loop did not have self loop...");
                    abort();
                }
                assert(BB->successorsNum() == 1 &&
                       "Should have only one successor");

                // continue here to rename the only label if needed
            }

            // if the BB has only one successor and the terminator
            // instruction is going to be sliced away, it means that
            // this is going to be an unconditional jump,
            // so just make the label 0
            if (BB->successorsNum() == 1 &&
                BB->getLastNode()->getSlice() != slice_id) {
                auto edge = *(BB->successors().begin());

                // modify the edge
                edge.label = 0;
                if (edge.target == oldExitBB) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

                    edge.target = newExitBB;
                }

                // replace the only edge
                BB->removeSuccessors();
                BB->addSuccessor(edge);

                continue;
            }

            // when we have more successors, we need to fill in
            // jumps under labels that we sliced away

            DGContainer<uint8_t> labels;
            // go through BBs successors and gather all labels
            // from edges that go from this BB. Also if there's
            // a jump to return block, replace it with new
            // return block
            for (const auto &succ : BB->successors()) {
                // skip artificial return basic block.
                if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL ||
                    succ.target == oldExitBB)
                    continue;

                labels.insert(succ.label);
            }

            // replace missing labels. Label should be from 0 to some max,
            // no gaps, so jump to safe exit under missing labels
            for (unsigned i = 0; i < tinst->getNumSuccessors(); ++i) {
                if (!labels.contains(i)) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

#ifndef NDEBUG
                    bool ret =
#endif
                            BB->addSuccessor(newExitBB, i);
                    assert(ret && "Already had this CFG edge, that is wrong");
                }
            }

            // this BB is going to be removed
            if (newExitBB)
                BB->removeSuccessorsTarget(oldExitBB);

            // if we have all successor edges pointing to the same
            // block, replace them with one successor (thus making
            // unconditional jump)
            if (BB->successorsNum() > 1 && BB->successorsAreSame()) {
                LLVMBBlock *succ = BB->successors().begin()->target;

                BB->removeSuccessors();
                BB->addSuccessor(succ, 0);
#ifdef NDEBUG
                assert(BB->successorsNum() == 1 &&
                       "BUG: in removeSuccessors() or addSuccessor()");
#endif
            }

#ifndef NDEBUG
            // check the BB
            labels.clear();
            for (const auto &succ : BB->successors()) {
                assert((!newExitBB || succ.target != oldExitBB) &&
                       "A block has the old BB as successor");
                // we can have more labels with different targets,
                // but we can not have one target with more labels
                assert(labels.insert(succ.label) && "Already have a label");
            }

            // check that we have all labels without any gep
            auto l = labels.begin();
            for (unsigned i = 0; i < labels.size(); ++i) {
                // set is ordered, so this must hold
                assert((*l == LLVMBBlock::MAX_BBLOCK_LABEL || i == *l++) &&
                       "Labels have a gap");
            }
#endif
        }

        if (newExitBB) {
            graph->addBlock(newExitBB->getKey(), newExitBB);
            assert(graph->getExitBB() == newExitBB);
            // NOTE: do not delete the old block
            // because it is the unified BB that is kept in
            // unique_ptr, so it will be deleted later automatically.
            // Deleting it would lead to double-free
        }
    }